

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

void free_yang_common(lys_module *module,lys_node *node)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0;
  yang_tpdf_free(module->ctx,module->tpdf,'\0',module->tpdf_size);
  module->tpdf_size = '\0';
  yang_free_ident_base(module->ident,0,(uint)module->ident_size);
  yang_free_nodes(module->ctx,node);
  for (uVar1 = 0; uVar1 < module->augment_size; uVar1 = uVar1 + 1) {
    yang_free_augment(module->ctx,(lys_node_augment *)(module->augment->padding + lVar2 + -0x1c));
    lVar2 = lVar2 + 0x68;
  }
  module->augment_size = '\0';
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < module->deviation_size; uVar1 = uVar1 + 1) {
    yang_free_deviate(module->ctx,(lys_deviation *)((long)&module->deviation->target_name + lVar2),0
                     );
    free(*(void **)((long)&module->deviation->deviate + lVar2));
    lVar2 = lVar2 + 0x38;
  }
  module->deviation_size = '\0';
  return;
}

Assistant:

static void
free_yang_common(struct lys_module *module, struct lys_node *node)
{
    uint i;
    yang_tpdf_free(module->ctx, module->tpdf, 0, module->tpdf_size);
    module->tpdf_size = 0;
    yang_free_ident_base(module->ident, 0, module->ident_size);
    yang_free_nodes(module->ctx, node);
    for (i = 0; i < module->augment_size; ++i) {
        yang_free_augment(module->ctx, &module->augment[i]);
    }
    module->augment_size = 0;
    for (i = 0; i < module->deviation_size; ++i) {
        yang_free_deviate(module->ctx, &module->deviation[i], 0);
        free(module->deviation[i].deviate);
    }
    module->deviation_size = 0;
}